

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.hpp
# Opt level: O1

iterator __thiscall
boost::unordered::detail::
table_impl<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,double>>,unsigned_int,double,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
::find_node_impl<unsigned_int,std::equal_to<unsigned_int>>
          (table_impl<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,double>>,unsigned_int,double,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
           *this,size_t key_hash,uint *k,equal_to<unsigned_int> *eq)

{
  long *plVar1;
  long lVar2;
  link_pointer ppVar3;
  iterator iVar4;
  ulong uVar5;
  
  uVar5 = *(long *)(this + 8) - 1U & key_hash;
  if ((*(long *)(this + 0x10) == 0) ||
     (plVar1 = *(long **)(*(long *)(this + 0x28) + uVar5 * 8), plVar1 == (long *)0x0)) {
    iVar4.node_ = (node_pointer)0x0;
  }
  else {
    lVar2 = *plVar1;
    iVar4.node_ = (node_pointer)(lVar2 + -0x10);
    if (lVar2 == 0) {
      iVar4.node_ = (node_pointer)0x0;
    }
  }
  if (iVar4.node_ != (node_pointer)0x0) {
    do {
      if ((iVar4.node_)->hash_ == key_hash) {
        if (*k == *(uint *)&((iVar4.node_)->super_value_base<std::pair<const_unsigned_int,_double>_>
                            ).data_.data_) {
          return (iterator)iVar4.node_;
        }
      }
      else if (((iVar4.node_)->hash_ & *(long *)(this + 8) - 1U) != uVar5) {
        return (iterator)(node_pointer)0x0;
      }
      ppVar3 = ((iVar4.node_)->super_ptr_bucket).next_;
      iVar4.node_ = (node_pointer)(ppVar3 + -2);
    } while (ppVar3 != (link_pointer)0x0);
    iVar4.node_ = (node_pointer)0x0;
  }
  return (iterator)iVar4.node_;
}

Assistant:

std::size_t hash_to_bucket(std::size_t hash) const
        {
            return policy::to_bucket(bucket_count_, hash);
        }